

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void GrcManager::DebugHex(ostream *strmOut,gid16 wGlyphID)

{
  undefined4 uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  undefined1 uVar4;
  ostream *poVar5;
  
  uVar1 = *(undefined4 *)(&strmOut->field_0x18 + (long)strmOut->_vptr_basic_ostream[-3]);
  *(undefined4 *)(&strmOut->field_0x18 + (long)strmOut->_vptr_basic_ostream[-3]) = 8;
  uVar4 = std::ios::fill();
  pp_Var2 = strmOut->_vptr_basic_ostream;
  p_Var3 = pp_Var2[-3];
  *(uint *)(&strmOut->field_0x18 + (long)p_Var3) =
       *(uint *)(&strmOut->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
  *(uint *)(&strmOut->field_0x18 + (long)pp_Var2[-3]) =
       *(uint *)(&strmOut->field_0x18 + (long)pp_Var2[-3]) & 0xfffffdff;
  poVar5 = std::operator<<(strmOut,"0x");
  poVar5 = std::operator<<(poVar5,0x30);
  *(undefined8 *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) = 4;
  std::ostream::operator<<(poVar5,wGlyphID);
  pp_Var2 = strmOut->_vptr_basic_ostream;
  *(undefined4 *)(&strmOut->field_0x18 + (long)pp_Var2[-3]) = uVar1;
  p_Var3 = pp_Var2[-3];
  std::ios::fill();
  (&strmOut->field_0xe0)[(long)p_Var3] = uVar4;
  return;
}

Assistant:

void GrcManager::DebugHex(std::ostream & strmOut, gid16 wGlyphID)
{
	auto const flags = strmOut.flags(std::ios::hex); auto const fill = strmOut.fill();
	strmOut << std::hex << std::noshowbase
			<< "0x"  << std::setfill('0') << std::setw(4) << wGlyphID;
	strmOut.flags(flags); strmOut.fill(fill);
}